

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams_from_file.hpp
# Opt level: O0

void __thiscall
iutest::detail::iuCsvFileParamsGenerator<int>::iuCsvFileParamsGenerator
          (iuCsvFileParamsGenerator<int> *this,string *path,char delimiter)

{
  params_t local_38;
  char local_19;
  string *psStack_18;
  char delimiter_local;
  string *path_local;
  iuCsvFileParamsGenerator<int> *this_local;
  
  (this->super_iuValuesInParamsGenerator<int>).super_iuIParamGenerator<int>._vptr_iuIParamGenerator
       = (_func_int **)&PTR__iuCsvFileParamsGenerator_0018e2c0;
  local_19 = delimiter;
  psStack_18 = path;
  path_local = (string *)this;
  ReadParams(&local_38,this,path,delimiter);
  iuValuesInParamsGenerator<int>::iuValuesInParamsGenerator
            (&this->super_iuValuesInParamsGenerator<int>,&local_38);
  std::vector<int,_std::allocator<int>_>::~vector(&local_38);
  (this->super_iuValuesInParamsGenerator<int>).super_iuIParamGenerator<int>._vptr_iuIParamGenerator
       = (_func_int **)&PTR__iuCsvFileParamsGenerator_0018e2c0;
  return;
}

Assistant:

explicit iuCsvFileParamsGenerator(const ::std::string& path, char delimiter = ',')
        : iuValuesInParamsGenerator<T>(ReadParams(path, delimiter))
    {
    }